

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table_iterators.h
# Opt level: O2

void __thiscall
draco::VertexRingIterator<draco::CornerTable>::Next(VertexRingIterator<draco::CornerTable> *this)

{
  uint uVar1;
  CornerIndex CVar2;
  
  CVar2.value_ = (this->corner_).value_;
  if (this->left_traversal_ == true) {
    CVar2 = CornerTable::SwingLeft(this->corner_table_,CVar2);
    (this->corner_).value_ = CVar2.value_;
    uVar1 = (this->start_corner_).value_;
    if (CVar2.value_ == 0xffffffff) {
      (this->corner_).value_ = uVar1;
      this->left_traversal_ = false;
    }
    else if (CVar2.value_ == uVar1) {
      (this->corner_).value_ = 0xffffffff;
    }
  }
  else {
    CVar2 = CornerTable::SwingRight(this->corner_table_,CVar2);
    (this->corner_).value_ = CVar2.value_;
  }
  return;
}

Assistant:

void Next() {
    if (left_traversal_) {
      corner_ = corner_table_->SwingLeft(corner_);
      if (corner_ == kInvalidCornerIndex) {
        // Open boundary reached.
        corner_ = start_corner_;
        left_traversal_ = false;
      } else if (corner_ == start_corner_) {
        // End reached.
        corner_ = kInvalidCornerIndex;
      }
    } else {
      // Go to the right until we reach a boundary there (no explicit check
      // is needed in this case).
      corner_ = corner_table_->SwingRight(corner_);
    }
  }